

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddFunction
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ParseableFunctionInfo *function,
          SRCINFO *srcInfo,ByteCodeCache *cache)

{
  byte bVar1;
  Type value;
  ushort uVar2;
  Type TVar3;
  Type value_00;
  NestedArray *pNVar4;
  undefined8 uVar5;
  code *pcVar6;
  SerializedFieldList SVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  LocalScopeInfoId value_01;
  HRESULT HVar11;
  undefined4 extraout_var;
  undefined4 *puVar12;
  undefined4 extraout_var_00;
  DeferredFunctionStub *deferredStubs;
  int *piVar13;
  ScopeInfo *scopeInfo;
  undefined8 *puVar14;
  FunctionInfo *this_00;
  BufferBuilderList *builder_00;
  undefined8 *puVar15;
  undefined8 *puVar16;
  ParseableFunctionInfo *function_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar17;
  Type TVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  FunctionBody *pFVar22;
  FunctionBody *function_01;
  uint32 local_4c;
  FunctionBody *pFStack_48;
  uint32 sourceDiff;
  SerializedFieldList local_40;
  SerializedFieldList definedFields;
  
  local_40 = (SerializedFieldList)0x0;
  local_4c = 0;
  definedFields = (SerializedFieldList)builder;
  uVar9 = ParseableFunctionInfo::StartOffset(function);
  bVar8 = TryConvertToUInt32((ulong)uVar9,&local_4c);
  if (bVar8) {
    if (function->m_lineNumber != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x1000000000000);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"Line Number",function->m_lineNumber,
                   (BufferBuilderInt32 **)0x0);
    }
    if (function->m_columnNumber != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x2000000000000);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"Column Number",function->m_columnNumber
                   ,(BufferBuilderInt32 **)0x0);
    }
    iVar10 = (*(function->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[7])(function);
    uVar2 = *(ushort *)&(function->super_FunctionProxy).field_0x45;
    bVar1 = (function->super_FunctionProxy).field_0x47;
    uVar19 = (uint)uVar2;
    uVar20 = (uint)uVar2;
    uVar21 = (uint)bVar1;
    uVar21 = ((uVar20 & 0x600 | bVar1 & 1) << 9 | (uVar20 & 0x80) << 0x12) + (uVar21 & 8) * 2 |
             (uVar21 & 2) << 9 | (uVar21 & 0x20) << 0x13 |
             (uVar19 & 0x40) << 8 |
             (uVar19 & 0x20) << 0xc |
             (uVar2 >> 1 & 4 | uVar2 >> 2 & 1) + (uVar19 & 0x10) * 4 | bVar1 >> 1 & 2 |
             (uint)((char16 *)CONCAT44(extraout_var,iVar10) == L"Anonymous function") << 0x14 |
             uVar2 >> 9 & 8 | uVar2 >> 1 & 0x80 | uVar2 >> 5 & 0x100 | (uVar20 & 0x4000) << 8 |
             (uVar20 & 0x8000) << 6;
    bVar8 = FunctionProxy::IsFunctionBody(&function->super_FunctionProxy);
    pFStack_48 = (FunctionBody *)function;
    if (bVar8) {
      bVar8 = FunctionProxy::IsFunctionBody(&function->super_FunctionProxy);
      if (!bVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar8) goto LAB_008806e3;
        *puVar12 = 0;
      }
      uVar19 = *(uint *)&pFStack_48->field_0x178;
      uVar21 = uVar21 | (uVar19 >> 10 & 0x800) + (uVar19 & 8) * 4 | uVar19 >> 8 & 0x1000 |
                        uVar19 >> 0xb & 0x2000 | uVar19 >> 8 & 0x8000 | uVar19 >> 9 & 0x10000 |
                        uVar19 >> 3 & 0x800000;
      function_01 = pFStack_48;
    }
    else {
      function_01 = (FunctionBody *)0x0;
    }
    PrependConstantInt32
              (this,(BufferBuilderList *)definedFields,L"BitFlags",uVar21,
               (ConstantSizedBufferBuilderOf<int> **)0x0);
    pFVar22 = pFStack_48;
    if ((char16 *)CONCAT44(extraout_var,iVar10) != L"Anonymous function") {
      iVar10 = (*(pFStack_48->super_ParseableFunctionInfo).super_FunctionProxy.
                 super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                 [7])(pFStack_48);
      PrependString16(this,(BufferBuilderList *)definedFields,L"Display Name",
                      (LPCWSTR)CONCAT44(extraout_var_00,iVar10),
                      (pFVar22->super_ParseableFunctionInfo).m_displayNameLength * 2 + 2);
    }
    if ((pFVar22->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_008806e3;
      *puVar12 = 0;
      pFVar22 = pFStack_48;
    }
    PrependInt32(this,(BufferBuilderList *)definedFields,L"Relative Function ID",
                 ((pFVar22->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                 functionId - this->topFunctionId,(BufferBuilderInt32 **)0x0);
    if ((pFVar22->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_008806e3;
      *puVar12 = 0;
      pFVar22 = pFStack_48;
    }
    if ((FunctionBody *)
        (((pFVar22->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != pFVar22) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar8) goto LAB_008806e3;
      *puVar12 = 0;
      pFVar22 = pFStack_48;
    }
    value_00 = ((pFVar22->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
               attributes;
    if ((value_00 &
        ~(HomeObj|ComputedName|Method|BaseConstructorKind|AllowDirectSuper|CanDefer|
          EnclosedByGlobalFunc|Async|Generator|CapturesThis|Lambda|ClassConstructor|ClassMethod|
          SuperReference|DeferredParse|ErrorOnNew)) != None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x924,
                                  "((attributes & ~(FunctionInfo::Attributes::ErrorOnNew | FunctionInfo::Attributes::SuperReference | FunctionInfo::Attributes::Lambda | FunctionInfo::Attributes::Async | FunctionInfo::Attributes::CapturesThis | FunctionInfo::Attributes::Generator | FunctionInfo::Attributes::ClassConstructor | FunctionInfo::Attributes::BaseConstructorKind | FunctionInfo::Attributes::ClassMethod | FunctionInfo::Attributes::Method | FunctionInfo::Attributes::EnclosedByGlobalFunc | FunctionInfo::Attributes::AllowDirectSuper | FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::CanDefer | FunctionInfo::Attributes::ComputedName | FunctionInfo::Attributes::HomeObj)) == 0)"
                                  ,
                                  "Only the ErrorOnNew|SuperReference|Lambda|CapturesThis|Generator|ClassConstructor|BaseConstructorKind|Async|ClassMember|Method|EnclosedByGlobalFunc|AllowDirectSuper|ComputedName|DeferredParse|CanDefer|HomeObj attributes should be set on a serialized function"
                                 );
      if (!bVar8) goto LAB_008806e3;
      *puVar12 = 0;
      pFVar22 = pFStack_48;
    }
    if (value_00 != None) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x4000000000000);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"Attributes",value_00,
                   (BufferBuilderInt32 **)0x0);
    }
    SVar7 = definedFields;
    PrependInt32(this,(BufferBuilderList *)definedFields,L"Offset Into Source",local_4c,
                 (BufferBuilderInt32 **)0x0);
    uVar9 = ParseableFunctionInfo::PrintableStartOffset(&pFVar22->super_ParseableFunctionInfo);
    PrependInt32(this,(BufferBuilderList *)SVar7,L"Offset Into Source for toString",uVar9,
                 (BufferBuilderInt32 **)0x0);
    pNVar4 = (pFVar22->super_ParseableFunctionInfo).nestedArray.ptr;
    if ((pNVar4 != (NestedArray *)0x0) && (pNVar4->nestedCount != 0)) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x8000000000000);
      if (pNVar4 == (NestedArray *)0x0) {
        TVar18 = 0;
      }
      else {
        TVar18 = pNVar4->nestedCount;
      }
      PrependInt32(this,(BufferBuilderList *)definedFields,L"Nested count",TVar18,
                   (BufferBuilderInt32 **)0x0);
    }
    deferredStubs =
         (DeferredFunctionStub *)FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar22,DeferredStubs);
    if (((value_00 & DeferredParse) != None && deferredStubs != (DeferredFunctionStub *)0x0) &&
       ((this->dwFlags & 4) != 0)) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x800000000000000);
      pNVar4 = (pFVar22->super_ParseableFunctionInfo).nestedArray.ptr;
      if (pNVar4 == (NestedArray *)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = pNVar4->nestedCount;
      }
      AddDeferredStubs(this,(BufferBuilderList *)definedFields,deferredStubs,uVar9,cache,true);
    }
    piVar13 = (int *)FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar22,PrintOffsets);
    SVar7 = definedFields;
    if (piVar13 != (int *)0x0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x2000000000000000);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"Start print offset",*piVar13,
                   (BufferBuilderInt32 **)0x0);
      PrependInt32(this,(BufferBuilderList *)SVar7,L"End print offset",piVar13[1],
                   (BufferBuilderInt32 **)0x0);
    }
    pFVar22 = pFStack_48;
    scopeInfo = (ScopeInfo *)FunctionProxy::GetAuxPtr((FunctionProxy *)pFStack_48,ScopeInfo);
    if ((value_00 & (CanDefer|DeferredParse)) != None && scopeInfo != (ScopeInfo *)0x0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x1000000000000000);
      value_01 = GetScopeInfoId(this,scopeInfo);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"ScopeInfo LocalId",value_01,
                   (BufferBuilderInt32 **)0x0);
    }
    value = (pFVar22->super_ParseableFunctionInfo).flags;
    if (value != Flags_None) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 1);
      PrependByte(this,(BufferBuilderList *)definedFields,L"flags",value);
    }
    TVar18 = (pFVar22->super_ParseableFunctionInfo).m_grfscr;
    if (TVar18 != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 2);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"m_grfscr",TVar18,
                   (BufferBuilderInt32 **)0x0);
    }
    TVar3 = (pFVar22->super_ParseableFunctionInfo).m_inParamCount;
    if (TVar3 != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 4);
      PrependInt16(this,(BufferBuilderList *)definedFields,L"m_inParamCount",TVar3,
                   (BufferBuilderInt16 **)0x0);
    }
    TVar3 = (pFVar22->super_ParseableFunctionInfo).m_reportedInParamCount;
    if (TVar3 != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 8);
      PrependInt16(this,(BufferBuilderList *)definedFields,L"m_reportedInParamCount",TVar3,
                   (BufferBuilderInt16 **)0x0);
    }
    TVar18 = (pFVar22->super_ParseableFunctionInfo).m_cchStartOffset;
    if (TVar18 != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x10);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"m_cchStartOffset",TVar18,
                   (BufferBuilderInt32 **)0x0);
    }
    TVar18 = (pFVar22->super_ParseableFunctionInfo).m_cchLength;
    if (TVar18 != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x20);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"m_cchLength",TVar18,
                   (BufferBuilderInt32 **)0x0);
    }
    TVar18 = (pFVar22->super_ParseableFunctionInfo).m_cbLength;
    if (TVar18 != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x40);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"m_cbLength",TVar18,
                   (BufferBuilderInt32 **)0x0);
    }
    TVar18 = (pFVar22->super_ParseableFunctionInfo).m_displayShortNameOffset;
    if (TVar18 != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x80);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"m_displayShortNameOffset",TVar18,
                   (BufferBuilderInt32 **)0x0);
    }
    TVar18 = (pFVar22->super_ParseableFunctionInfo).scopeSlotArraySize;
    if (TVar18 != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x100);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"scopeSlotArraySize",TVar18,
                   (BufferBuilderInt32 **)0x0);
    }
    TVar18 = (pFVar22->super_ParseableFunctionInfo).paramScopeSlotArraySize;
    if (TVar18 != 0) {
      local_40 = (SerializedFieldList)((ulong)local_40 | 0x200);
      PrependInt32(this,(BufferBuilderList *)definedFields,L"paramScopeSlotArraySize",TVar18,
                   (BufferBuilderInt32 **)0x0);
    }
    AddPropertyIdsForScopeSlotArray
              (this,(BufferBuilderList *)definedFields,&pFVar22->super_ParseableFunctionInfo);
    if (function_01 != (FunctionBody *)0x0) {
      AddFunctionBody(this,(BufferBuilderList *)definedFields,function_01,srcInfo,&local_40);
    }
    pNVar4 = (pFVar22->super_ParseableFunctionInfo).nestedArray.ptr;
    if ((pNVar4 != (NestedArray *)0x0) && (pNVar4->nestedCount != 0)) {
      uVar9 = 0;
      puVar14 = (undefined8 *)new<Memory::ArenaAllocator>(0x20,this->alloc,0x366bee);
      puVar14[1] = L"Nest Function Bodies";
      *(undefined4 *)(puVar14 + 2) = 0xffffffff;
      *puVar14 = &PTR_FixOffset_014f2eb8;
      puVar14[3] = 0;
      while( true ) {
        SVar7 = definedFields;
        pNVar4 = (pFVar22->super_ParseableFunctionInfo).nestedArray.ptr;
        uVar21 = 0;
        if (pNVar4 != (NestedArray *)0x0) {
          uVar21 = pNVar4->nestedCount;
        }
        if (uVar21 <= uVar9) break;
        this_00 = ParseableFunctionInfo::GetNestedFunc(&pFVar22->super_ParseableFunctionInfo,uVar9);
        if (((this_00 == (FunctionInfo *)0x0) ||
            ((this_00->functionBodyImpl).ptr == (FunctionProxy *)0x0)) ||
           ((this_00->attributes & DeferredDeserialize) != None)) {
          PrependConstantInt32
                    (this,(BufferBuilderList *)definedFields,L"Empty Nested Function",0,
                     (ConstantSizedBufferBuilderOf<int> **)0x0);
        }
        else {
          builder_00 = (BufferBuilderList *)new<Memory::ArenaAllocator>(0x20,this->alloc,0x366bee);
          (builder_00->super_BufferBuilder).clue = L"Nested Function";
          (builder_00->super_BufferBuilder).offset = 0xffffffff;
          (builder_00->super_BufferBuilder)._vptr_BufferBuilder =
               (_func_int **)&PTR_FixOffset_014f2eb8;
          builder_00->list = (ImmutableList<Js::BufferBuilder_*> *)0x0;
          uVar5 = puVar14[3];
          puVar15 = (undefined8 *)new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
          *puVar15 = builder_00;
          puVar15[1] = uVar5;
          puVar14[3] = puVar15;
          puVar15 = (undefined8 *)new<Memory::ArenaAllocator>(0x28,this->alloc,0x366bee);
          SVar7 = definedFields;
          puVar15[1] = L"Offset To Nested Function";
          *(undefined4 *)(puVar15 + 2) = 0xffffffff;
          *puVar15 = &PTR_FixOffset_014f2e80;
          puVar15[3] = builder_00;
          *(undefined4 *)(puVar15 + 4) = 0;
          uVar5 = *(undefined8 *)((long)definedFields + 0x18);
          puVar16 = (undefined8 *)new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
          *puVar16 = puVar15;
          puVar16[1] = uVar5;
          *(undefined8 **)((long)SVar7 + 0x18) = puVar16;
          function_00 = FunctionInfo::GetParseableFunctionInfo(this_00);
          pFVar22 = pFStack_48;
          AddFunction(this,builder_00,function_00,srcInfo,cache);
        }
        uVar9 = uVar9 + 1;
      }
      uVar5 = *(undefined8 *)((long)definedFields + 0x18);
      puVar15 = (undefined8 *)new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
      *puVar15 = puVar14;
      puVar15[1] = uVar5;
      *(undefined8 **)((long)SVar7 + 0x18) = puVar15;
    }
    SVar7 = definedFields;
    pIVar17 = regex::ImmutableList<Js::BufferBuilder_*>::ReverseCurrentList
                        (*(ImmutableList<Js::BufferBuilder_*> **)((long)definedFields + 0x18));
    *(ImmutableList<Js::BufferBuilder_*> **)((long)SVar7 + 0x18) = pIVar17;
    PrependStruct<Js::SerializedFieldList>
              (this,(BufferBuilderList *)SVar7,L"Serialized Field List",&local_40);
    HVar11 = 0;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x8ce,"(0)","0");
    if (!bVar8) {
LAB_008806e3:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar12 = 0;
    HVar11 = -0x7ffdfdff;
  }
  return HVar11;
}

Assistant:

HRESULT AddFunction(BufferBuilderList & builder, ParseableFunctionInfo * function, SRCINFO const * srcInfo, ByteCodeCache* cache)
    {
        SerializedFieldList definedFields = { 0 };

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start Function Table"), magicStartOfFunctionBody);
#endif

        uint32 sourceDiff = 0;

        if (!TryConvertToUInt32(function->StartOffset(), &sourceDiff))
        {
            Assert(0); // Likely a bug
            return ByteCodeSerializer::CantGenerate;
        }

        if (function->m_lineNumber != 0)
        {
            definedFields.has_m_lineNumber = true;
            PrependInt32(builder, _u("Line Number"), function->m_lineNumber);
        }

        if (function->m_columnNumber != 0)
        {
            definedFields.has_m_columnNumber = true;
            PrependInt32(builder, _u("Column Number"), function->m_columnNumber);
        }

        bool isAnonymous = function->GetIsAnonymousFunction();

        // FunctionBody Details
        DWORD bitFlags =
            (function->m_isDeclaration ? ffIsDeclaration : 0)
            | (function->m_hasImplicitArgIns ? ffHasImplicitArgsIn : 0)
            | (function->m_isAccessor ? ffIsAccessor : 0)
            | (function->m_isStaticNameFunction ? ffIsStaticNameFunction : 0)
            | (function->m_isNamedFunctionExpression ? ffIsNamedFunctionExpression : 0)
            | (function->m_isNameIdentifierRef ? ffIsNameIdentifierRef : 0)
            | (function->m_isGlobalFunc ? ffIsGlobalFunc : 0)
            | (function->m_dontInline ? ffDontInline : 0)
            | (function->m_isStrictMode ? ffIsStrictMode : 0)
            | (function->m_doBackendArgumentsOptimization ? ffDoBackendArgumentsOptimization : 0)
            | (function->m_doScopeObjectCreation ? ffDoScopeObjectCreation : 0)
            | (function->m_usesArgumentsObject ? ffUsesArgumentsObject : 0)
            | (function->m_isEval ? ffIsEval : 0)
            | (function->m_isDynamicFunction ? ffIsDynamicFunction : 0)
            | (isAnonymous ? ffIsAnonymous : 0)
            | (function->m_isMethod ? ffIsMethod : 0)
            | (function->m_isClassMember ? ffIsClassMember : 0)
#ifdef ASMJS_PLAT
            | (function->m_isAsmjsMode ? ffIsAsmJsMode : 0)
            | (function->m_isAsmJsFunction ? ffIsAsmJsFunction : 0)
#endif
            ;

        FunctionBody *functionBody = nullptr;
        if (function->IsFunctionBody())
        {
            functionBody = function->GetFunctionBody();

            bitFlags |=
                (functionBody->m_isFuncRegistered ? ffIsFuncRegistered : 0)
                | (functionBody->m_hasAllNonLocalReferenced ? ffhasAllNonLocalReferenced : 0)
                | (functionBody->m_hasSetIsObject ? ffhasSetIsObject : 0)
                | (functionBody->m_CallsEval ? ffhasSetCallsEval : 0)
                | (functionBody->m_ChildCallsEval ? ffChildCallsEval : 0)
                | (functionBody->m_hasReferenceableBuiltInArguments ? ffHasReferenceableBuiltInArguments : 0)
                | (functionBody->m_isParamAndBodyScopeMerged ? ffIsParamAndBodyScopeMerged : 0);
        }

        PrependConstantInt32(builder, _u("BitFlags"), bitFlags);

        if (!isAnonymous)
        {
            const char16* displayName = function->GetDisplayName();
            uint displayNameLength = function->m_displayNameLength;
            PrependString16(builder, _u("Display Name"), displayName, (displayNameLength + 1) * sizeof(char16));
        }

        PrependInt32(builder, _u("Relative Function ID"), function->GetLocalFunctionId() - topFunctionId); // Serialized function ids are relative to the top function ID
        auto attributes = function->GetAttributes();
        AssertMsg((attributes &
            ~(FunctionInfo::Attributes::ErrorOnNew
                | FunctionInfo::Attributes::SuperReference
                | FunctionInfo::Attributes::Lambda
                | FunctionInfo::Attributes::Async
                | FunctionInfo::Attributes::CapturesThis
                | FunctionInfo::Attributes::Generator
                | FunctionInfo::Attributes::ClassConstructor
                | FunctionInfo::Attributes::BaseConstructorKind
                | FunctionInfo::Attributes::ClassMethod
                | FunctionInfo::Attributes::Method
                | FunctionInfo::Attributes::EnclosedByGlobalFunc
                | FunctionInfo::Attributes::AllowDirectSuper
                | FunctionInfo::Attributes::DeferredParse
                | FunctionInfo::Attributes::CanDefer
                | FunctionInfo::Attributes::ComputedName
                | FunctionInfo::Attributes::HomeObj)) == 0,
            "Only the ErrorOnNew|SuperReference|Lambda|CapturesThis|Generator|ClassConstructor|BaseConstructorKind|Async|ClassMember|Method|EnclosedByGlobalFunc|AllowDirectSuper|ComputedName|DeferredParse|CanDefer|HomeObj attributes should be set on a serialized function");
        if (attributes != FunctionInfo::Attributes::None)
        {
            definedFields.has_attributes = true;
            PrependInt32(builder, _u("Attributes"), attributes);
        }

        PrependInt32(builder, _u("Offset Into Source"), sourceDiff);
        PrependInt32(builder, _u("Offset Into Source for toString"), function->PrintableStartOffset());
        if (function->GetNestedCount() > 0)
        {
            definedFields.has_m_nestedCount = true;
            PrependInt32(builder, _u("Nested count"), function->GetNestedCount());
        }

        DeferredFunctionStub* deferredStubs = function->GetDeferredStubs();
        if (deferredStubs != nullptr
            && (attributes & FunctionInfo::Attributes::DeferredParse) != 0
            && GenerateParserStateCache())
        {
            definedFields.has_deferredStubs = true;
            AddDeferredStubs(builder, deferredStubs, function->GetNestedCount(), cache, true);
        }

        PrintOffsets* printOffsets = function->GetPrintOffsets();
        if (printOffsets != nullptr)
        {
            definedFields.has_printOffsets = true;
            PrependInt32(builder, _u("Start print offset"), printOffsets->cbStartPrintOffset);
            PrependInt32(builder, _u("End print offset"), printOffsets->cbEndPrintOffset);
        }

        ScopeInfo* scopeInfo = function->GetScopeInfo();
        if (scopeInfo != nullptr
            && (attributes & (FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::CanDefer)) != 0)
        {
            definedFields.has_scopeInfo = true;
            AddScopeInfo(builder, scopeInfo);
        }

#define PrependArgSlot PrependInt16
#define PrependRegSlot PrependInt32
#define PrependCharCount PrependInt32
#define PrependULong PrependInt32
#define PrependUInt16 PrependInt16
#define PrependUInt32 PrependInt32

#define DEFINE_FUNCTION_PROXY_FIELDS 1
#define DEFINE_PARSEABLE_FUNCTION_INFO_FIELDS 1
#define DECLARE_SERIALIZABLE_FIELD(type, name, serializableType) \
        if (function->##name != 0) { \
            definedFields.has_##name = true; \
            Prepend##serializableType(builder, _u(#name), function->##name); \
        }

#include "SerializableFunctionFields.h"

        AddPropertyIdsForScopeSlotArray(builder, function);

        if (functionBody != nullptr)
        {
            AddFunctionBody(builder, functionBody, srcInfo, definedFields);
        }

        // Lastly, write each of the lexically enclosed functions
        if (function->GetNestedCount())
        {
            auto nestedBodyList = Anew(alloc, BufferBuilderList, _u("Nest Function Bodies"));

            for (uint32 i = 0; i < function->GetNestedCount(); ++i)
            {
                auto nestedFunction = function->GetNestedFunc(i);
                if (nestedFunction == nullptr || !nestedFunction->HasParseableInfo())
                {
                    PrependConstantInt32(builder, _u("Empty Nested Function"), 0);
                }
                else
                {
                    auto nestedFunctionBuilder = Anew(alloc, BufferBuilderList, _u("Nested Function"));
                    nestedBodyList->list = nestedBodyList->list->Prepend(nestedFunctionBuilder, alloc);
                    auto offsetToNested = Anew(alloc, BufferBuilderRelativeOffset, _u("Offset To Nested Function"), nestedFunctionBuilder);
                    builder.list = builder.list->Prepend(offsetToNested, alloc);
                    AddFunction(*nestedFunctionBuilder, nestedFunction->GetParseableFunctionInfo(), srcInfo, cache);
                }
            }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
            PrependInt32(builder, _u("End Function Body"), magicEndOfFunctionBody);
#endif

            builder.list = builder.list->Prepend(nestedBodyList, alloc);
        }
        else
        {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            PrependInt32(builder, _u("End Function Body"), magicEndOfFunctionBody);
#endif
        }

        // Reverse to put prepended items in correct order
        builder.list = builder.list->ReverseCurrentList();
        PrependStruct<SerializedFieldList>(builder, _u("Serialized Field List"), &definedFields);

        return S_OK;
    }